

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O3

adios2_varinfo *
adios2_inquire_blockinfo(adios2_engine *engine,adios2_variable *variable,size_t step)

{
  undefined4 uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  adios2_varinfo *paVar7;
  adios2_blockinfo *paVar8;
  size_t *psVar9;
  undefined8 *puVar10;
  void *pvVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
  blocksInfo;
  long local_a8;
  long local_a0;
  char local_81;
  void *local_80;
  size_t local_78;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_engine, in call to adios2_inquire_blockinfo","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for adios2_variable, in call to adios2_get","");
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar1 = *(undefined4 *)(variable + 0x28);
  local_80 = (void *)(**(code **)(*(long *)engine + 0x58))(engine,variable,step);
  if (local_80 == (void *)0x0) {
    switch(uVar1) {
    case 1:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<signed_char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<signed_char>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 4;
      sVar12 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x188);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x189);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x27);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 2:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<short>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<short>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 4;
      sVar12 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x188);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x189);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x27);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 3:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<int>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<int>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 3;
      sVar12 = lVar13 * -0x505050505050505;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * 0x6e6e6e6e6e6e6e70);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 400);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x191);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x28);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x33;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      break;
    case 4:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<long>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<long>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 5;
      sVar12 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x198);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x199);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x29);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 5:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_char>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 4;
      sVar12 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x188);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x189);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x27);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 6:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_short>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_short>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 4;
      sVar12 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x188);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x189);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x27);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_short>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_short>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 7:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_int>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 3;
      sVar12 = lVar13 * -0x505050505050505;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * 0x6e6e6e6e6e6e6e70);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 400);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x191);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x28);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x33;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_int>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_int>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 8:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<unsigned_long>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<unsigned_long>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 5;
      sVar12 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x198);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x199);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x29);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 9:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<float>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<float>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 3;
      sVar12 = lVar13 * -0x505050505050505;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * 0x6e6e6e6e6e6e6e70);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 400);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x191);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x28);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x33;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 10:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<double>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<double>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 5;
      sVar12 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x198);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x199);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x29);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<double>::BPInfo,_std::allocator<adios2::core::Variable<double>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 0xb:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<long_double>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<long_double>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 6;
      sVar12 = lVar13 * 0x6db6db6db6db6db7;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * 0x4924924924924930);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x1b8);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x1b9);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x2d);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x38;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 0xc:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::complex<float>>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::complex<float>>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 5;
      sVar12 = lVar13 * 0x4ec4ec4ec4ec4ec5;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x6276276276276270);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x198);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x199);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x29);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x34;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 0xd:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::complex<double>>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::complex<double>>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 3;
      sVar12 = lVar13 * 0x6fb586fb586fb587;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x1745d1745d1745d0);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x1b0);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x1b1);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x2c);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x37;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 0xe:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<std::__cxx11::string>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 3;
      sVar12 = lVar13 * 0x4fbcda3ac10c9715;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x14fbcda3ac10c970);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x1e0);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x1e1);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x32);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = puVar10[0x1c];
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x3d;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    case 0xf:
      __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                     &adios2::core::Variable<char>::typeinfo,0);
      adios2::core::Engine::BlocksInfo<char>((Variable *)&local_a8,(ulong)engine);
      paVar7 = (adios2_varinfo *)malloc(0x28);
      lVar13 = local_a0 - local_a8 >> 4;
      sVar12 = lVar13 * -0x70a3d70a3d70a3d7;
      paVar7->nblocks = sVar12;
      paVar8 = (adios2_blockinfo *)malloc(lVar13 * -0x3333333333333330);
      paVar7->BlocksInfo = paVar8;
      pvVar3 = *(void **)(local_a8 + 0x30);
      lVar13 = *(long *)(local_a8 + 0x38);
      paVar7->Dims = (int)((ulong)(lVar13 - (long)pvVar3) >> 3);
      sVar14 = lVar13 - (long)pvVar3;
      if (sVar14 == 0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        psVar9 = (size_t *)malloc(sVar14);
        memcpy(psVar9,pvVar3,sVar14);
      }
      paVar7->Shape = psVar9;
      paVar7->IsValue = (uint)*(byte *)(local_a8 + 0x188);
      paVar7->IsReverseDims = (uint)*(byte *)(local_a8 + 0x189);
      if (local_a0 != local_a8) {
        lVar13 = sVar12 + (sVar12 == 0);
        puVar10 = (undefined8 *)(local_a8 + 0x48);
        do {
          paVar8->WriterID = *(int *)(puVar10 + 0x27);
          paVar8->BlockID = puVar10[0x12];
          pvVar3 = (void *)*puVar10;
          sVar14 = puVar10[1] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Start = psVar9;
          pvVar3 = (void *)puVar10[3];
          sVar14 = puVar10[4] - (long)pvVar3;
          if (sVar14 == 0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            psVar9 = (size_t *)malloc(sVar14);
            memcpy(psVar9,pvVar3,sVar14);
          }
          paVar8->Count = psVar9;
          (paVar8->MinUnion).int64 = 0;
          (paVar8->MaxUnion).int64 = 0;
          (paVar8->Value).int64 = 0;
          paVar8 = paVar8 + 1;
          puVar10 = puVar10 + 0x32;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      std::
      vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                 *)&local_a8);
      return paVar7;
    default:
      return (adios2_varinfo *)0x0;
    }
    std::
    vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
    ::~vector((vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
               *)&local_a8);
    return paVar7;
  }
  paVar7 = (adios2_varinfo *)malloc(0x28);
  pvVar3 = *(void **)((long)local_80 + 0x20);
  pvVar4 = *(void **)((long)local_80 + 0x28);
  sVar14 = (long)pvVar4 - (long)pvVar3;
  sVar12 = ((long)sVar14 >> 4) * -0x3333333333333333;
  paVar7->nblocks = sVar12;
  paVar7->Shape = (size_t *)0x0;
  paVar8 = (adios2_blockinfo *)malloc(sVar14);
  paVar7->BlocksInfo = paVar8;
  iVar2 = *(int *)((long)local_80 + 0xc);
  paVar7->Dims = iVar2;
  local_81 = *(char *)((long)local_80 + 8);
  if (local_81 == '\x01') {
    psVar9 = (size_t *)malloc(8);
    paVar7->Shape = psVar9;
    *psVar9 = *(size_t *)((long)local_80 + 0x10);
LAB_001209c5:
  }
  else {
    pvVar11 = *(void **)((long)local_80 + 0x10);
    if (pvVar11 != (void *)0x0) {
      local_78 = (long)iVar2 * 8;
      psVar9 = (size_t *)malloc(local_78);
      paVar7->Shape = psVar9;
      memcpy(psVar9,pvVar11,local_78);
      goto LAB_001209c5;
    }
  }
  local_78 = CONCAT44(local_78._4_4_,(uint)*(byte *)((long)local_80 + 0x18));
  paVar7->IsValue = (uint)*(byte *)((long)local_80 + 0x18);
  paVar7->IsReverseDims = (uint)*(byte *)((long)local_80 + 0x19);
  if (pvVar4 == pvVar3) {
    if (pvVar3 == (void *)0x0) goto LAB_00120af7;
  }
  else {
    lVar13 = sVar12 + (sVar12 == 0);
    sVar14 = (long)iVar2 << 3;
    lVar15 = 0;
    do {
      *(undefined4 *)((long)&paVar8->WriterID + lVar15) = *(undefined4 *)((long)pvVar3 + lVar15);
      *(undefined8 *)((long)&paVar8->BlockID + lVar15) = *(undefined8 *)((long)pvVar3 + lVar15 + 8);
      if (local_81 == '\0') {
        puVar10 = (undefined8 *)((long)&paVar8->Start + lVar15);
        *puVar10 = 0;
        *(undefined8 *)((long)&paVar8->Count + lVar15) = 0;
        pvVar4 = *(void **)((long)pvVar3 + lVar15 + 0x10);
        if (pvVar4 != (void *)0x0) {
          pvVar11 = malloc(sVar14);
          *puVar10 = pvVar11;
          memcpy(pvVar11,pvVar4,sVar14);
        }
        pvVar4 = *(void **)((long)pvVar3 + lVar15 + 0x18);
        if (pvVar4 != (void *)0x0) {
          pvVar11 = malloc(sVar14);
          *(void **)((long)&paVar8->Count + lVar15) = pvVar11;
          memcpy(pvVar11,pvVar4,sVar14);
        }
      }
      else {
        puVar10 = (undefined8 *)malloc(8);
        *(undefined8 **)((long)&paVar8->Start + lVar15) = puVar10;
        *puVar10 = *(undefined8 *)((long)pvVar3 + lVar15 + 0x10);
        puVar10 = (undefined8 *)malloc(8);
        *(undefined8 **)((long)&paVar8->Count + lVar15) = puVar10;
        *puVar10 = *(undefined8 *)((long)pvVar3 + lVar15 + 0x18);
      }
      if ((char)local_78 == '\0') {
        puVar10 = (undefined8 *)((long)pvVar3 + lVar15 + 0x20);
        uVar6 = puVar10[1];
        puVar5 = (undefined8 *)((long)&paVar8->MinUnion + lVar15);
        *puVar5 = *puVar10;
        puVar5[1] = uVar6;
        puVar10 = (undefined8 *)((long)pvVar3 + lVar15 + 0x30);
        uVar6 = puVar10[1];
        puVar5 = (undefined8 *)((long)&paVar8->MaxUnion + lVar15);
        *puVar5 = *puVar10;
        puVar5[1] = uVar6;
      }
      else {
        puVar5 = *(undefined8 **)((long)pvVar3 + lVar15 + 0x40);
        uVar6 = puVar5[1];
        puVar10 = (undefined8 *)((long)&paVar8->Value + lVar15);
        *puVar10 = *puVar5;
        puVar10[1] = uVar6;
      }
      lVar15 = lVar15 + 0x50;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  operator_delete(pvVar3);
LAB_00120af7:
  operator_delete(local_80);
  return paVar7;
}

Assistant:

adios2_varinfo *adios2_inquire_blockinfo(adios2_engine *engine, adios2_variable *variable,
                                         const size_t step)
{
    auto lf_CopyDims = [](const std::vector<size_t> &dims) -> size_t * {
        size_t *a = nullptr;
        size_t ndims = dims.size();
        if (ndims > 0)
        {
            a = (size_t *)malloc(dims.size() * sizeof(size_t));
            std::memcpy(a, dims.data(), dims.size() * sizeof(size_t));
        }
        return a;
    };

    adios2_varinfo *varinfo = NULL;

    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_inquire_blockinfo");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        const auto minBlocksInfo = engineCpp->MinBlocksInfo(*variableBase, step);

        if (minBlocksInfo)
        {
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = minBlocksInfo->BlocksInfo.size();
            varinfo->Shape = NULL;
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = minBlocksInfo->Dims;
            if (minBlocksInfo->WasLocalValue)
            {
                varinfo->Shape = (size_t *)malloc(sizeof(size_t));
                varinfo->Shape[0] = (intptr_t)minBlocksInfo->Shape;
            }
            else
            {
                if (minBlocksInfo->Shape)
                {
                    varinfo->Shape = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                    memcpy(varinfo->Shape, minBlocksInfo->Shape,
                           sizeof(size_t) * minBlocksInfo->Dims);
                }
            }
            varinfo->IsValue = (int)minBlocksInfo->IsValue;
            varinfo->IsReverseDims = (int)minBlocksInfo->IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = minBlocksInfo->BlocksInfo[i].WriterID;
                b[i].BlockID = minBlocksInfo->BlocksInfo[i].BlockID;
                if (minBlocksInfo->WasLocalValue)
                {
                    b[i].Start = (size_t *)malloc(sizeof(size_t));
                    b[i].Start[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Start;
                    b[i].Count = (size_t *)malloc(sizeof(size_t));
                    b[i].Count[0] = (intptr_t)minBlocksInfo->BlocksInfo[i].Count;
                }
                else
                {
                    b[i].Start = b[i].Count = NULL;
                    if (minBlocksInfo->BlocksInfo[i].Start)
                    {
                        b[i].Start = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Start, minBlocksInfo->BlocksInfo[i].Start,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                    if (minBlocksInfo->BlocksInfo[i].Count)
                    {
                        b[i].Count = (size_t *)malloc(sizeof(size_t) * minBlocksInfo->Dims);
                        memcpy(b[i].Count, minBlocksInfo->BlocksInfo[i].Count,
                               sizeof(size_t) * minBlocksInfo->Dims);
                    }
                }
                if (minBlocksInfo->IsValue)
                {
                    memcpy(&b[i].Value, minBlocksInfo->BlocksInfo[i].BufferP, sizeof(b[i].Value));
                }
                else
                {
                    memcpy(&b[i].MinUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MinUnion,
                           sizeof(b[i].MinUnion));
                    memcpy(&b[i].MaxUnion, &minBlocksInfo->BlocksInfo[i].MinMax.MaxUnion,
                           sizeof(b[i].MaxUnion));
                }
            }
            delete minBlocksInfo;
            return varinfo;
        }

        /* Call the big gun Engine::BlocksInfo<T> */
        if (type == adios2::DataType::Struct)
        {
            return varinfo;
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const auto blocksInfo = engineCpp->BlocksInfo<std::string>(
                *dynamic_cast<adios2::core::Variable<std::string> *>(variableBase), step);
            varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));
            varinfo->nblocks = blocksInfo.size();
            varinfo->BlocksInfo =
                (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));
            auto *b = varinfo->BlocksInfo;

            varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());
            varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);
            varinfo->IsValue = (int)blocksInfo[0].IsValue;
            varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;
            for (size_t i = 0; i < varinfo->nblocks; ++i)
            {
                b[i].WriterID = blocksInfo[i].WriterID;
                b[i].BlockID = blocksInfo[i].BlockID;
                b[i].Start = lf_CopyDims(blocksInfo[i].Start);
                b[i].Count = lf_CopyDims(blocksInfo[i].Count);
                // minBlocksInfo->BlocksInfo[i].MinUnion;
                b[i].MinUnion.uint64 = 0;
                // minBlocksInfo->BlocksInfo[i].MaxUnion;
                b[i].MaxUnion.uint64 = 0;
                b[i].Value.str = (char *)blocksInfo[i].Value.data();
            };
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const auto blocksInfo = engineCpp->BlocksInfo<T>(                                          \
            *dynamic_cast<adios2::core::Variable<T> *>(variableBase), step);                       \
        varinfo = (adios2_varinfo *)malloc(sizeof(adios2_varinfo));                                \
        varinfo->nblocks = blocksInfo.size();                                                      \
        varinfo->BlocksInfo =                                                                      \
            (adios2_blockinfo *)malloc(varinfo->nblocks * sizeof(adios2_blockinfo));               \
        auto *b = varinfo->BlocksInfo;                                                             \
                                                                                                   \
        varinfo->Dims = static_cast<int>(blocksInfo[0].Shape.size());                              \
        varinfo->Shape = lf_CopyDims(blocksInfo[0].Shape);                                         \
        varinfo->IsValue = (int)blocksInfo[0].IsValue;                                             \
        varinfo->IsReverseDims = (int)blocksInfo[0].IsReverseDims;                                 \
        for (size_t i = 0; i < varinfo->nblocks; ++i)                                              \
        {                                                                                          \
            b[i].WriterID = blocksInfo[i].WriterID;                                                \
            b[i].BlockID = blocksInfo[i].BlockID;                                                  \
            b[i].Start = lf_CopyDims(blocksInfo[i].Start);                                         \
            b[i].Count = lf_CopyDims(blocksInfo[i].Count);                                         \
            b[i].MinUnion.uint64 = 0;                                                              \
            b[i].MaxUnion.uint64 = 0;                                                              \
            b[i].Value.uint64 = 0;                                                                 \
        };                                                                                         \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_inquire_blockinfo");
        return NULL;
    }
    return varinfo;
}